

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall
parser::Node::indent2string_abi_cxx11_(string *__return_storage_ptr__,Node *this,int indent)

{
  stringstream local_1a0 [8];
  stringstream stream;
  ostream local_190 [380];
  int local_14;
  string *psStack_10;
  int indent_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  while (local_14 != 0) {
    local_14 = local_14 + -1;
    std::operator<<(local_190,"  ");
  }
  local_14 = local_14 + -1;
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string indent2string(int indent = 0) {
            std::stringstream stream;
            while (indent--)
                stream << "  ";
            return stream.str();
        }